

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_vector.c
# Opt level: O2

void vector_push_front(vector v,void *element)

{
  ulong uVar1;
  void *__src;
  int iVar2;
  undefined8 in_RAX;
  undefined8 uVar3;
  ulong uVar4;
  void *__dest;
  
  uVar3 = CONCAT71((int7)((ulong)in_RAX >> 8),v == (vector)0x0);
  if (element != (void *)0x0 && v != (vector)0x0) {
    if ((v->size == v->capacity) && (iVar2 = vector_reserve(v,v->size * 2), iVar2 != 0)) {
      log_write_impl_va("metacall",0x168,"vector_push_front",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_vector.c"
                        ,LOG_LEVEL_ERROR,"Vector reserve error",uVar3);
    }
    uVar1 = v->type_size;
    __src = v->data;
    if (__src == (void *)0x0) {
      __dest = (void *)0x0;
    }
    else {
      uVar4 = v->capacity * uVar1;
      __dest = (void *)0x0;
      if (uVar1 <= uVar4 && uVar4 - uVar1 != 0) {
        __dest = (void *)((long)__src + uVar1);
      }
    }
    memmove(__dest,__src,uVar1 * v->size);
    memcpy(v->data,element,v->type_size);
    v->size = v->size + 1;
  }
  return;
}

Assistant:

void vector_push_front(vector v, void *element)
{
	if (v != NULL && element != NULL)
	{
		if (v->size == v->capacity)
		{
			if (vector_reserve(v, v->capacity * VECTOR_CAPACITY_INCREMENT) != 0)
			{
				log_write("metacall", LOG_LEVEL_ERROR, "Vector reserve error");
			}
		}

		memmove(vector_data_offset_bytes(v, v->type_size), v->data, v->size * v->type_size);

		memcpy(v->data, element, v->type_size);

		++v->size;
	}
}